

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void perf_get_interest_points
               (_func_void_fasthessian_ptr_vector<interest_point,_std::allocator<interest_point>_>_ptr
                *function,fasthessian *fh,benchmark_data *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  reference pvVar3;
  undefined8 uVar4;
  long in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  double dVar6;
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double flops_per_cycle;
  size_t i_1;
  vector<interest_point,_std::allocator<interest_point>_> dummy_interest_points_1;
  size_t j;
  double total_cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  size_t i;
  vector<interest_point,_std::allocator<interest_point>_> dummy_interest_points;
  uint64_t end;
  uint64_t start;
  double multiplier;
  long num_runs;
  double cycles;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict *in_stack_ffffffffffffff18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff38;
  vector<interest_point,_std::allocator<interest_point>_> *in_stack_ffffffffffffff40;
  ulong local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  ulong local_98;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  ulong local_70;
  undefined1 local_58 [24];
  unsigned_long_long local_40;
  unsigned_long_long local_38;
  double local_30;
  ulong local_28;
  double local_20;
  long local_18;
  undefined8 local_10;
  code *local_8;
  
  local_20 = 0.0;
  local_28 = 100;
  local_30 = 1.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    auVar8 = ZEXT864((ulong)((double)(long)local_28 * local_30));
    local_28 = (ulong)((double)(long)local_28 * local_30);
    std::vector<interest_point,_std::allocator<interest_point>_>::vector
              ((vector<interest_point,_std::allocator<interest_point>_> *)0x10fa6f);
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_38 = start_tsc();
    for (local_70 = 0; auVar5 = auVar8._0_16_, local_70 < local_28; local_70 = local_70 + 1) {
      auVar8._0_8_ = (*local_8)(local_10,local_58);
      auVar8._8_56_ = extraout_var;
    }
    local_40 = stop_tsc(local_38);
    std::vector<interest_point,_std::allocator<interest_point>_>::clear
              ((vector<interest_point,_std::allocator<interest_point>_> *)0x10fb3d);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_40);
    local_20 = auVar5._0_8_;
    local_30 = 100000000.0 / local_20;
    std::vector<interest_point,_std::allocator<interest_point>_>::~vector
              ((vector<interest_point,_std::allocator<interest_point>_> *)
               in_stack_ffffffffffffff20._M_current);
  } while (2.0 < local_30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10fb9a);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  local_90 = 0.0;
  for (local_98 = 0; local_98 < 10; local_98 = local_98 + 1) {
    in_stack_ffffffffffffff20._M_current = (double *)&local_b0;
    std::vector<interest_point,_std::allocator<interest_point>_>::vector
              ((vector<interest_point,_std::allocator<interest_point>_> *)0x10fbc8);
    std::vector<interest_point,_std::allocator<interest_point>_>::reserve
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_38 = start_tsc();
    for (local_b8 = 0; auVar5 = auVar9._0_16_, local_b8 < local_28; local_b8 = local_b8 + 1) {
      auVar9._0_8_ = (*local_8)(local_10,&local_b0);
      auVar9._8_56_ = extraout_var_00;
    }
    local_40 = stop_tsc(local_38);
    std::vector<interest_point,_std::allocator<interest_point>_>::clear
              ((vector<interest_point,_std::allocator<interest_point>_> *)0x10fc81);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_40);
    local_20 = auVar5._0_8_ / (double)(long)local_28;
    local_90 = local_90 + local_20;
    auVar9 = ZEXT864((ulong)local_90);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20._M_current,
               in_stack_ffffffffffffff18);
    std::vector<interest_point,_std::allocator<interest_point>_>::~vector
              ((vector<interest_point,_std::allocator<interest_point>_> *)
               in_stack_ffffffffffffff20._M_current);
  }
  local_90 = local_90 / 10.0;
  auVar7._0_8_ = ((double)*(long *)(local_18 + 0x210) * 100.0) / local_90;
  auVar7._8_8_ = 0;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar10._8_8_ = 0x3fdfffffffffffff;
  auVar10._0_8_ = 0x3fdfffffffffffff;
  auVar5 = vpternlogq_avx512vl(auVar10,auVar7,auVar12,0xf8);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar7._0_8_ + auVar5._0_8_;
  auVar5 = vroundsd_avx(auVar7,auVar11,0xb);
  dVar6 = auVar5._0_8_ / 100.0;
  __last._M_current = (double *)&local_88;
  local_20 = local_90;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff08);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff08);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_ffffffffffffff20,__last);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_20;
  uVar4 = vcvttsd2usi_avx512f(auVar5);
  *(undefined8 *)(local_18 + 0x218) = uVar4;
  this = &local_88;
  pvVar3 = std::vector<double,_std::allocator<double>_>::front(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *pvVar3;
  uVar4 = vcvttsd2usi_avx512f(auVar1);
  *(undefined8 *)(local_18 + 0x220) = uVar4;
  pvVar3 = std::vector<double,_std::allocator<double>_>::back(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pvVar3;
  uVar4 = vcvttsd2usi_avx512f(auVar2);
  *(undefined8 *)(local_18 + 0x228) = uVar4;
  *(double *)(local_18 + 0x230) = dVar6;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20._M_current);
  return;
}

Assistant:

void perf_get_interest_points(void (*function)(struct fasthessian *, std::vector<struct interest_point> *),
                              struct fasthessian *fh, struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);
        dummy_interest_points.clear();

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        std::vector<struct interest_point> dummy_interest_points;
        dummy_interest_points.reserve(num_runs * data.num_interest_points);

        start = start_tsc();

        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(fh, &dummy_interest_points);
        }
        end = stop_tsc(start);

        dummy_interest_points.clear();

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}